

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::GenerateImportFile(cmGlobalGenerator *this,string *file)

{
  bool bVar1;
  pointer ppVar2;
  reference this_00;
  pointer this_01;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *m;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  *__range3;
  iterator iStack_30;
  bool result;
  _Self local_28;
  iterator it;
  string *file_local;
  cmGlobalGenerator *this_local;
  
  it._M_node = (_Base_ptr)file;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
       ::find(&this->BuildExportSets,file);
  iStack_30 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
              ::end(&this->BuildExportSets);
  bVar1 = std::operator!=(&local_28,&stack0xffffffffffffffd0);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
             ::operator->(&local_28);
    this_local._7_1_ =
         cmExportFileGenerator::GenerateImportFile(&ppVar2->second->super_cmExportFileGenerator);
    if ((this->ConfigureDoneCMP0026AndCMP0024 & 1U) == 0) {
      __end3 = std::
               vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ::begin(&this->Makefiles);
      m = (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
          std::
          vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
          ::end(&this->Makefiles);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
                                         *)&m), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
                  ::operator*(&__end3);
        this_01 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(this_00)
        ;
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
                 ::operator->(&local_28);
        cmMakefile::RemoveExportBuildFileGeneratorCMP0024(this_01,ppVar2->second);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    std::
    map<std::__cxx11::string,cmExportBuildFileGenerator*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,cmExportBuildFileGenerator*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>>
                        *)&this->BuildExportSets,(iterator)local_28._M_node);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::GenerateImportFile(const std::string& file)
{
  auto const it = this->BuildExportSets.find(file);
  if (it != this->BuildExportSets.end()) {
    bool result = it->second->GenerateImportFile();

    if (!this->ConfigureDoneCMP0026AndCMP0024) {
      for (const auto& m : this->Makefiles) {
        m->RemoveExportBuildFileGeneratorCMP0024(it->second);
      }
    }

    this->BuildExportSets.erase(it);
    return result;
  }
  return false;
}